

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxquality.hpp
# Opt level: O0

void __thiscall
soplex::SPxSolverBase<double>::qualSlackViolation
          (SPxSolverBase<double> *this,double *maxviol,double *sumviol)

{
  int iVar1;
  SVectorBase<double> *this_00;
  double *pdVar2;
  undefined4 in_EDX;
  int __c;
  undefined4 in_register_00000014;
  double *in_RSI;
  long *in_RDI;
  Real RVar3;
  double viol;
  int col;
  double val;
  SVectorBase<double> *rowvec;
  int row;
  VectorBase<double> slacks;
  VectorBase<double> solu;
  int in_stack_ffffffffffffff3c;
  SPxLPBase<double> *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  VectorBase<double> *in_stack_ffffffffffffff50;
  double dVar4;
  uint local_6c;
  SPxLPBase<double> *local_68;
  int local_58;
  undefined1 local_48 [24];
  undefined1 local_30 [24];
  double *local_18;
  double *local_10;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  local_18 = (double *)CONCAT44(in_register_00000014,in_EDX);
  *in_RSI = 0.0;
  *local_18 = 0.0;
  local_10 = in_RSI;
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x25341f);
  VectorBase<double>::VectorBase(in_stack_ffffffffffffff50,iVar1);
  SPxLPBase<double>::nRows((SPxLPBase<double> *)0x253438);
  VectorBase<double>::VectorBase(in_stack_ffffffffffffff50,iVar1);
  (**(code **)(*in_RDI + 0x300))(in_RDI,local_30);
  (**(code **)(*in_RDI + 0x308))(in_RDI,local_48);
  local_58 = 0;
  while( true ) {
    iVar1 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2534a1);
    if (iVar1 <= local_58) break;
    this_00 = SPxLPBase<double>::rowVector(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    local_68 = (SPxLPBase<double> *)0x0;
    local_6c = 0;
    while( true ) {
      iVar1 = SVectorBase<double>::size(this_00);
      if (iVar1 <= (int)local_6c) break;
      pdVar2 = SVectorBase<double>::value(this_00,local_6c);
      dVar4 = *pdVar2;
      SVectorBase<double>::index(this_00,(char *)(ulong)local_6c,__c);
      pdVar2 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c)
      ;
      local_68 = (SPxLPBase<double> *)(dVar4 * *pdVar2 + (double)local_68);
      local_6c = local_6c + 1;
    }
    pdVar2 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)local_68,in_stack_ffffffffffffff3c);
    RVar3 = spxAbs<double>((double)local_68 - *pdVar2);
    if (*local_10 <= RVar3 && RVar3 != *local_10) {
      *local_10 = RVar3;
    }
    *local_18 = RVar3 + *local_18;
    local_58 = local_58 + 1;
    in_stack_ffffffffffffff40 = local_68;
  }
  VectorBase<double>::~VectorBase((VectorBase<double> *)0x253638);
  VectorBase<double>::~VectorBase((VectorBase<double> *)0x253645);
  return;
}

Assistant:

void SPxSolverBase<R>::qualSlackViolation(R& maxviol, R& sumviol) const
{
   maxviol = 0.0;
   sumviol = 0.0;

   VectorBase<R> solu(this->nCols());
   VectorBase<R> slacks(this->nRows());

   getPrimalSol(solu);
   getSlacks(slacks);

   for(int row = 0; row < this->nRows(); ++row)
   {
      const SVectorBase<R>& rowvec = this->rowVector(row);

      R val = 0.0;

      for(int col = 0; col < rowvec.size(); ++col)
         val += rowvec.value(col) * solu[rowvec.index(col)];

      R viol = spxAbs(val - slacks[row]);

      if(viol > maxviol)
         maxviol = viol;

      sumviol += viol;
   }
}